

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O1

void __thiscall
burst::dynamic_tuple::accomodate<int>(dynamic_tuple *this,int *object,int8_t *creation_place)

{
  pointer *ppoVar1;
  iterator __position;
  size_t sVar2;
  object_info_t local_20;
  
  *(int *)creation_place = *object;
  sVar2 = (long)creation_place -
          (long)(this->m_data)._M_t.
                super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
                super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
                super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  local_20.manage = management::manage<int>;
  __position._M_current =
       (this->m_objects).
       super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_objects).
      super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.offset = sVar2;
    std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
    ::_M_realloc_insert<burst::management::object_info_t>(&this->m_objects,__position,&local_20);
  }
  else {
    (__position._M_current)->offset = sVar2;
    (__position._M_current)->manage = management::manage<int>;
    ppoVar1 = &(this->m_objects).
               super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppoVar1 = *ppoVar1 + 1;
  }
  this->m_volume = sVar2 + 4;
  return;
}

Assistant:

void accomodate (T && object, std::int8_t * creation_place)
        {
            using raw_type = std::decay_t<T>;
            new (creation_place) raw_type(std::forward<T>(object));

            const auto new_offset = static_cast<std::size_t>(creation_place - data());
            m_objects.push_back(management::make_object_info<raw_type>(new_offset));
            m_volume = new_offset + sizeof(raw_type);
        }